

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  const_reference name;
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
  *this_01;
  cmArgumentParser<Arguments> *pcVar5;
  string *psVar6;
  char *pcVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  static_string_view sVar11;
  bool local_4b1;
  bool local_491;
  bool local_411;
  undefined1 local_410 [7];
  bool has_newline;
  string line;
  string local_3e8 [3];
  char hex [4];
  char c;
  string output;
  long offset;
  long sizeLimit;
  string local_3b0 [39];
  allocator<char> local_389;
  undefined1 local_388 [8];
  string error;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string fileName;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_110;
  undefined1 local_100 [8];
  Arguments arguments;
  cmArgumentParser<Arguments> local_88;
  const_reference local_68;
  string *variable;
  string *fileNameArg;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"READ must be called with at least two additional arguments",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    variable = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
    local_68 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,2);
    if ((HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
         ::parser == '\0') &&
       (iVar3 = __cxa_guard_acquire(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                     ::parser), iVar3 != 0)) {
      local_88.Bindings.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.Bindings.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.Bindings.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmArgumentParser<Arguments>::cmArgumentParser(&local_88);
      sVar11 = ::cm::operator____s("OFFSET",6);
      this_01 = (cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                 *)cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                   ::Bind<std::__cxx11::string>
                             ((cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                               *)&local_88,sVar11,0);
      sVar11 = ::cm::operator____s("LIMIT",5);
      pcVar5 = cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
               ::Bind<std::__cxx11::string>(this_01,sVar11,0x20);
      sVar11 = ::cm::operator____s("HEX",3);
      arguments._64_8_ = sVar11.super_string_view._M_len;
      pcVar5 = cmArgumentParser<Arguments>::Bind<bool>(pcVar5,sVar11,0x40);
      cmArgumentParser<Arguments>::cmArgumentParser(&HandleReadCommand::parser,pcVar5);
      cmArgumentParser<Arguments>::~cmArgumentParser(&local_88);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::parser);
    }
    join_0x00000010_0x00000000_ =
         cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   (local_20);
    local_110 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)((long)&fileName.field_2 + 8),3);
    cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_100,
               (cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                *)&HandleReadCommand::parser,&local_110,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
    std::__cxx11::string::string((string *)local_140,(string *)variable);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_140);
    if (!bVar1) {
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)local_140,(string *)psVar6);
      std::operator+(&local_160,"/",variable);
      std::__cxx11::string::operator+=((string *)local_140,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
    }
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&error.field_2 + 8),pcVar7,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    if ((bVar2 & 1) == 0) {
      offset = -1;
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar3 = atoi(pcVar7);
        offset = (long)iVar3;
      }
      output.field_2._8_4_ = 0;
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        output.field_2._8_4_ = atoi(pcVar7);
      }
      std::istream::seekg((long)((long)&error.field_2 + 8),output.field_2._8_4_);
      std::__cxx11::string::string(local_3e8);
      if ((arguments.Limit.field_2._M_local_buf[8] & 1U) == 0) {
        std::__cxx11::string::string((string *)local_410);
        local_411 = false;
        while( true ) {
          local_4b1 = false;
          if (offset != 0) {
            local_4b1 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)(error.field_2._M_local_buf + 8),(string *)local_410,
                                   &local_411,offset);
          }
          if (local_4b1 == false) break;
          if (0 < offset) {
            lVar10 = std::__cxx11::string::size();
            offset = offset - lVar10;
            if ((local_411 & 1U) != 0) {
              offset = offset + -1;
            }
            if (offset < 0) {
              offset = 0;
            }
          }
          std::__cxx11::string::operator+=(local_3e8,(string *)local_410);
          if ((local_411 & 1U) != 0) {
            std::__cxx11::string::operator+=(local_3e8,"\n");
          }
        }
        std::__cxx11::string::~string((string *)local_410);
      }
      else {
        while( true ) {
          local_491 = false;
          if (offset != 0) {
            plVar9 = (long *)std::istream::get(error.field_2._M_local_buf + 8);
            local_491 = std::ios::operator_cast_to_bool
                                  ((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
          }
          if (local_491 == false) break;
          sprintf(line.field_2._M_local_buf + 0xb,"%.2x",(ulong)(byte)line.field_2._M_local_buf[0xf]
                 );
          std::__cxx11::string::operator+=(local_3e8,line.field_2._M_local_buf + 0xb);
          if (0 < offset) {
            offset = offset + -1;
          }
        }
      }
      name = local_68;
      this_00 = (this->super_cmCommand).Makefile;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,name,pcVar7);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string(local_3e8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,"failed to open for reading (",&local_389);
      std::allocator<char>::~allocator(&local_389);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::operator+=((string *)local_388,local_3b0);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::operator+=((string *)local_388,"):\n  ");
      std::__cxx11::string::operator+=((string *)local_388,(string *)local_140);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_388);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_388);
    }
    std::ifstream::~ifstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_140);
    HandleReadCommand::Arguments::~Arguments((Arguments *)local_100);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3));

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg;
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }

  // is there a limit?
  long sizeLimit = -1;
  if (!arguments.Limit.empty()) {
    sizeLimit = atoi(arguments.Limit.c_str());
  }

  // is there an offset?
  long offset = 0;
  if (!arguments.Offset.empty()) {
    offset = atoi(arguments.Offset.c_str());
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit != 0) && (file.get(c))) {
      char hex[4];
      sprintf(hex, "%.2x", c & 0xff);
      output += hex;
      if (sizeLimit > 0) {
        sizeLimit--;
      }
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit != 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      if (sizeLimit > 0) {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline) {
          sizeLimit--;
        }
        if (sizeLimit < 0) {
          sizeLimit = 0;
        }
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}